

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::impl::anon_unknown_0::xpath_allocator::release(xpath_allocator *this)

{
  xpath_memory_block *pxVar1;
  xpath_memory_block *next;
  xpath_memory_block *cur;
  xpath_allocator *this_local;
  
  next = this->_root;
  if (next == (xpath_memory_block *)0x0) {
    __assert_fail("cur",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x1ee9,"void pugi::impl::(anonymous namespace)::xpath_allocator::release()");
  }
  while (next->next != (xpath_memory_block *)0x0) {
    pxVar1 = next->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)(next);
    next = pxVar1;
  }
  return;
}

Assistant:

void release()
		{
			xpath_memory_block* cur = _root;
			assert(cur);

			while (cur->next)
			{
				xpath_memory_block* next = cur->next;

				xml_memory::deallocate(cur);

				cur = next;
			}
		}